

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

int lyv_multicases(lyd_node *node,lys_node *schemanode,lyd_node **first_sibling,int autodelete,
                  lyd_node *nodel)

{
  lyd_node *plVar1;
  lys_node *plVar2;
  bool bVar3;
  lyd_node *local_68;
  lyd_node *iter;
  lyd_node *next;
  lys_node *saux;
  lys_node *scase;
  lys_node *schoice;
  lys_node *sparent;
  lyd_node *nodel_local;
  int autodelete_local;
  lyd_node **first_sibling_local;
  lys_node *schemanode_local;
  lyd_node *node_local;
  
  if ((node == (lyd_node *)0x0) && (schemanode == (lys_node *)0x0)) {
    __assert_fail("node || schemanode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x37d,
                  "int lyv_multicases(struct lyd_node *, struct lys_node *, struct lyd_node **, int, struct lyd_node *)"
                 );
  }
  first_sibling_local = (lyd_node **)schemanode;
  if (schemanode == (lys_node *)0x0) {
    first_sibling_local = (lyd_node **)node->schema;
  }
  schoice = lys_parent((lys_node *)first_sibling_local);
  while( true ) {
    bVar3 = false;
    if (schoice != (lys_node *)0x0) {
      bVar3 = schoice->nodetype == LYS_USES;
    }
    if (!bVar3) break;
    schoice = lys_parent(schoice);
  }
  if ((((schoice != (lys_node *)0x0) && ((schoice->nodetype & (LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN)
       ) && (first_sibling != (lyd_node **)0x0)) && (*first_sibling != (lyd_node *)0x0)) {
    if (schoice->nodetype == LYS_CHOICE) {
      scase = schoice;
      saux = (lys_node *)first_sibling_local;
    }
    else {
      scase = lys_parent(schoice);
      saux = schoice;
    }
    while( true ) {
      plVar1 = *first_sibling;
      while (local_68 = plVar1, local_68 != (lyd_node *)0x0) {
        plVar1 = local_68->next;
        if ((lys_node *)first_sibling_local != local_68->schema) {
          schoice = lys_parent(local_68->schema);
          while( true ) {
            bVar3 = false;
            if (schoice != (lys_node *)0x0) {
              bVar3 = schoice->nodetype == LYS_USES;
            }
            if (!bVar3) break;
            schoice = lys_parent(schoice);
          }
          if ((schoice != (lys_node *)0x0) &&
             (((schoice->nodetype == LYS_CHOICE && (schoice == scase)) ||
              ((schoice->nodetype == LYS_CASE &&
               ((schoice != saux && (plVar2 = lys_parent(schoice), plVar2 == scase)))))))) {
            if (autodelete == 0) {
              ly_vlog((ly_ctx *)first_sibling_local[6]->schema,LYE_MCASEDATA,LY_VLOG_LYD,local_68,
                      scase->name);
              return 1;
            }
            if (local_68 == nodel) {
              ly_vlog((ly_ctx *)first_sibling_local[6]->schema,LYE_MCASEDATA,LY_VLOG_LYD,local_68,
                      scase->name);
              return 2;
            }
            if (local_68 == *first_sibling) {
              *first_sibling = plVar1;
            }
            lyd_free(local_68);
          }
        }
      }
      if (((*first_sibling == (lyd_node *)0x0) ||
          (saux = lys_parent(scase), saux == (lys_node *)0x0)) ||
         ((saux->nodetype & LYS_CASE) == LYS_UNKNOWN)) break;
      scase = lys_parent(saux);
    }
  }
  return 0;
}

Assistant:

int
lyv_multicases(struct lyd_node *node, struct lys_node *schemanode, struct lyd_node **first_sibling,
               int autodelete, struct lyd_node *nodel)
{
    struct lys_node *sparent, *schoice, *scase, *saux;
    struct lyd_node *next, *iter;
    assert(node || schemanode);

    if (!schemanode) {
        schemanode = node->schema;
    }

    for (sparent = lys_parent(schemanode); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
    if (!sparent || !(sparent->nodetype & (LYS_CHOICE | LYS_CASE))) {
        /* node is not under any choice */
        return 0;
    } else if (!first_sibling || !(*first_sibling)) {
        /* nothing to check */
        return 0;
    }

    /* remember which case to skip in which choice */
    if (sparent->nodetype == LYS_CHOICE) {
        schoice = sparent;
        scase = schemanode;
    } else {
        schoice = lys_parent(sparent);
        scase = sparent;
    }

autodelete:
    /* remove all nodes from other cases than 'sparent' */
    LY_TREE_FOR_SAFE(*first_sibling, next, iter) {
        if (schemanode == iter->schema) {
            continue;
        }

        for (sparent = lys_parent(iter->schema); sparent && (sparent->nodetype == LYS_USES); sparent = lys_parent(sparent));
        if (sparent && ((sparent->nodetype == LYS_CHOICE && sparent == schoice) /* another implicit case */
                || (sparent->nodetype == LYS_CASE && sparent != scase && lys_parent(sparent) == schoice)) /* another case */
                ) {
            if (autodelete) {
                if (iter == nodel) {
                    LOGVAL(schemanode->module->ctx, LYE_MCASEDATA, LY_VLOG_LYD, iter, schoice->name);
                    return 2;
                }
                if (iter == *first_sibling) {
                    *first_sibling = next;
                }
                lyd_free(iter);
            } else {
                LOGVAL(schemanode->module->ctx, LYE_MCASEDATA, LY_VLOG_LYD, iter, schoice->name);
                return 1;
            }
        }
    }

    if (*first_sibling && (saux = lys_parent(schoice)) && (saux->nodetype & LYS_CASE)) {
        /* go recursively in case of nested choices */
        schoice = lys_parent(saux);
        scase = saux;
        goto autodelete;
    }

    return 0;
}